

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O1

void __thiscall
QGestureManager::cleanupGesturesForRemovedRecognizer(QGestureManager *this,QGesture *gesture)

{
  QGesture **ppQVar1;
  Node<QGesture_*,_QGestureRecognizer_*> *pNVar2;
  QGestureRecognizer **ppQVar3;
  Span *extraout_RDX;
  Span *pSVar4;
  long in_FS_OFFSET;
  const_iterator begin;
  const_iterator end;
  QGestureRecognizer *recognizer;
  QHash<QGestureRecognizer_*,_QSet<QGesture_*>_> local_68;
  Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> local_60;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.spans = (Span *)gesture;
  if ((*(Data<QHashPrivate::Node<QGesture*,QGestureRecognizer*>> **)(this + 0x58) ==
       (Data<QHashPrivate::Node<QGesture*,QGestureRecognizer*>> *)0x0) ||
     (pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QGestureRecognizer*>>::
               findNode<QGesture*>(*(Data<QHashPrivate::Node<QGesture*,QGestureRecognizer*>> **)
                                    (this + 0x58),(QGesture **)&local_60.spans),
     pNVar2 == (Node<QGesture_*,_QGestureRecognizer_*> *)0x0)) {
    ppQVar3 = (QGestureRecognizer **)0x0;
  }
  else {
    ppQVar3 = &pNVar2->value;
  }
  if (ppQVar3 == (QGestureRecognizer **)0x0) {
    local_60.seed = 0;
  }
  else {
    local_60.seed = (size_t)*ppQVar3;
  }
  if ((QGestureRecognizer *)local_60.seed == (QGestureRecognizer *)0x0) goto LAB_002d7142;
  QHash<QGesture*,QGestureRecognizer*>::removeImpl<QGesture*>
            ((QHash<QGesture*,QGestureRecognizer*> *)(this + 0x58),(QGesture **)&local_60.spans);
  QHash<QGesture_*,_QGestureRecognizer_*>::keys
            ((QList<QGesture_*> *)&local_60,(QHash<QGesture_*,_QGestureRecognizer_*> *)(this + 0x58)
             ,(QGestureRecognizer **)&local_60.seed);
  if ((Data *)local_60._0_8_ != (Data *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_60._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_60._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_60._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_60._0_8_,8,0x10);
    }
  }
  if (local_60.numBuckets != 0) goto LAB_002d7142;
  QHash<QGestureRecognizer_*,_QSet<QGesture_*>_>::value
            (&local_68,(QGestureRecognizer **)(this + 0x50));
  if (local_68.d == (Data *)0x0) {
    local_68.d = (Data *)0x0;
    pSVar4 = extraout_RDX;
LAB_002d70fe:
    local_60.size = 0;
  }
  else {
    pSVar4 = (local_68.d)->spans;
    if ((char)(((RefCount *)pSVar4->offsets)->atomic)._q_value.super___atomic_base<int>._M_i != -1)
    goto LAB_002d70fe;
    ppQVar1 = (QGesture **)0x1;
    do {
      local_60.size = (size_t)ppQVar1;
      if ((QGesture **)(local_68.d)->numBuckets == (QGesture **)local_60.size) {
        local_68.d = (Data *)0x0;
        local_60.size = (size_t)(QGesture **)0x0;
        break;
      }
      ppQVar1 = (QGesture **)(local_60.size + 1);
    } while (pSVar4[local_60.size >> 7].offsets[(uint)local_60.size & 0x7f] == 0xff);
  }
  local_38 = 0;
  uStack_30 = 0;
  begin.i.i.bucket = (size_t)&local_38;
  begin.i.i.d = &local_60;
  end.i.i.bucket = local_60.size;
  end.i.i.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)pSVar4;
  local_60._0_8_ = local_68.d;
  qDeleteAll<QSet<QGesture*>::const_iterator>(begin,end);
  QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&local_68);
  QHash<QGestureRecognizer*,QSet<QGesture*>>::removeImpl<QGestureRecognizer*>
            ((QHash<QGestureRecognizer*,QSet<QGesture*>> *)(this + 0x50),
             (QGestureRecognizer **)&local_60.seed);
  if ((QGestureRecognizer *)local_60.seed != (QGestureRecognizer *)0x0) {
    (*(*(_func_int ***)local_60.seed)[1])();
  }
LAB_002d7142:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGestureManager::cleanupGesturesForRemovedRecognizer(QGesture *gesture)
{
    QGestureRecognizer *recognizer = m_deletedRecognizers.value(gesture);
    if (!recognizer) //The Gesture is removed while in the even loop, so the recognizers for this gestures was removed
        return;
    m_deletedRecognizers.remove(gesture);
    if (m_deletedRecognizers.keys(recognizer).isEmpty()) {
        // no more active gestures, cleanup!
        qDeleteAll(m_obsoleteGestures.value(recognizer));
        m_obsoleteGestures.remove(recognizer);
        delete recognizer;
    }
}